

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::compressedtexsubimage3d_invalid_offset
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  GLuint local_14;
  NegativeTestContext *pNStack_10;
  deUint32 texture;
  NegativeTestContext *ctx_local;
  
  local_14 = 0x1234;
  pNStack_10 = ctx;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindTexture(&pNStack_10->super_CallLogWrapper,0x8c1a,local_14);
  pNVar1 = pNStack_10;
  iVar2 = etc2EacDataSize(4,4);
  glu::CallLogWrapper::glCompressedTexImage3D
            (&pNVar1->super_CallLogWrapper,0x8c1a,0,0x9278,4,4,1,0,iVar2,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE or GL_INVALID_OPERATION is generated if xoffset + width > texture_width or yoffset + height > texture_height."
             ,&local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pNVar1 = pNStack_10;
  iVar2 = etc2EacDataSize(8,4);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&pNVar1->super_CallLogWrapper,0x8c1a,0,0xc,0,0,8,4,1,0x9278,iVar2,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x501,0x502);
  pNVar1 = pNStack_10;
  iVar2 = etc2EacDataSize(4,8);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&pNVar1->super_CallLogWrapper,0x8c1a,0,0,0xc,0,4,8,1,0x9278,iVar2,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x501,0x502);
  pNVar1 = pNStack_10;
  iVar2 = etc2EacDataSize(4,4);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&pNVar1->super_CallLogWrapper,0x8c1a,0,0,0,0xc,4,4,1,0x9278,iVar2,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x501,0x502);
  pNVar1 = pNStack_10;
  iVar2 = etc2EacDataSize(8,8);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&pNVar1->super_CallLogWrapper,0x8c1a,0,0xc,0xc,0xc,8,8,1,0x9278,iVar2,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x501,0x502);
  NegativeTestContext::endSection(pNStack_10);
  glu::CallLogWrapper::glDeleteTextures(&pNStack_10->super_CallLogWrapper,1,&local_14);
  return;
}

Assistant:

void compressedtexsubimage3d_invalid_offset (NegativeTestContext& ctx)
{
	deUint32				texture = 0x1234;
	ctx.glGenTextures			(1, &texture);
	ctx.glBindTexture			(GL_TEXTURE_2D_ARRAY, texture);
	ctx.glCompressedTexImage3D	(GL_TEXTURE_2D_ARRAY, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 4, 4, 1, 0, etc2EacDataSize(4, 4), 0);
	ctx.expectError				(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE or GL_INVALID_OPERATION is generated if xoffset + width > texture_width or yoffset + height > texture_height.");

	ctx.glCompressedTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 12, 0, 0, 8, 4, 1, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(8, 4), 0);
	ctx.expectError(GL_INVALID_VALUE, GL_INVALID_OPERATION);
	ctx.glCompressedTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 12, 0, 4, 8, 1, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(4, 8), 0);
	ctx.expectError(GL_INVALID_VALUE, GL_INVALID_OPERATION);
	ctx.glCompressedTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 0, 12, 4, 4, 1, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(4, 4), 0);
	ctx.expectError(GL_INVALID_VALUE, GL_INVALID_OPERATION);
	ctx.glCompressedTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 12, 12, 12, 8, 8, 1, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(8, 8), 0);
	ctx.expectError(GL_INVALID_VALUE, GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteTextures		(1, &texture);
}